

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SAX2.c
# Opt level: O0

void xmlSAX2StartElement(void *ctx,xmlChar *fullname,xmlChar **atts)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  int local_64;
  int chk;
  int i;
  xmlChar *value;
  xmlChar *att;
  xmlChar *prefix;
  xmlChar *name;
  xmlNsPtr ns;
  xmlNodePtr parent;
  xmlNodePtr ret;
  xmlParserCtxtPtr ctxt;
  xmlChar **atts_local;
  xmlChar *fullname_local;
  void *ctx_local;
  
  if (((ctx != (void *)0x0) && (fullname != (xmlChar *)0x0)) && (*(long *)((long)ctx + 0x10) != 0))
  {
    ns = *(xmlNsPtr *)((long)ctx + 0x50);
    ret = (xmlNodePtr)ctx;
    ctxt = (xmlParserCtxtPtr)atts;
    atts_local = (xmlChar **)fullname;
    fullname_local = (xmlChar *)ctx;
    if (((*(int *)((long)ctx + 0x9c) != 0) && (*(long *)(*(long *)((long)ctx + 0x10) + 0x58) == 0))
       && ((*(long *)(*(long *)((long)ctx + 0x10) + 0x50) == 0 ||
           (((*(long *)(*(long *)(*(long *)((long)ctx + 0x10) + 0x50) + 0x48) == 0 &&
             (*(long *)(*(long *)(*(long *)((long)ctx + 0x10) + 0x50) + 0x50) == 0)) &&
            ((*(long *)(*(long *)(*(long *)((long)ctx + 0x10) + 0x50) + 0x58) == 0 &&
             (*(long *)(*(long *)(*(long *)((long)ctx + 0x10) + 0x50) + 0x60) == 0)))))))) {
      xmlErrValid((xmlParserCtxtPtr)ctx,XML_ERR_NO_DTD,"Validation failed: no DTD found !",
                  (char *)0x0,(char *)0x0);
      *(undefined4 *)((long)&ret[1].last + 4) = 0;
    }
    prefix = xmlSplitQName((xmlParserCtxtPtr)ret,(xmlChar *)atts_local,&att);
    parent = xmlNewDocNodeEatName((xmlDocPtr)ret->name,(xmlNsPtr)0x0,prefix,(xmlChar *)0x0);
    if (parent == (xmlNodePtr)0x0) {
      if (att != (xmlChar *)0x0) {
        (*xmlFree)(att);
      }
      xmlSAX2ErrMemory((xmlParserCtxtPtr)ret,"xmlSAX2StartElement");
    }
    else {
      if (*(long *)(ret->name + 0x18) == 0) {
        xmlAddChild((xmlNodePtr)ret->name,parent);
      }
      else if (ns == (xmlNsPtr)0x0) {
        ns = *(xmlNsPtr *)(ret->name + 0x18);
      }
      *(undefined4 *)&ret[3].prev = 0xffffffff;
      if ((*(int *)((long)&ret[3].ns + 4) != 0) && (ret->prev != (_xmlNode *)0x0)) {
        if (*(uint *)((long)&ret->prev->next + 4) < 0xffff) {
          parent->line = (unsigned_short)*(undefined4 *)((long)&ret->prev->next + 4);
        }
        else {
          parent->line = 0xffff;
        }
      }
      iVar1 = nodePush((xmlParserCtxtPtr)ret,parent);
      if (iVar1 < 0) {
        xmlUnlinkNode(parent);
        xmlFreeNode(parent);
        if (att != (xmlChar *)0x0) {
          (*xmlFree)(att);
        }
      }
      else {
        if (ns != (xmlNsPtr)0x0) {
          if (ns->type == XML_ELEMENT_NODE) {
            xmlAddChild((xmlNodePtr)ns,parent);
          }
          else {
            xmlAddSibling((xmlNodePtr)ns,parent);
          }
        }
        if (*(int *)((long)&ret->next + 4) == 0) {
          if ((*(long *)(ret->name + 0x50) != 0) || (*(long *)(ret->name + 0x58) != 0)) {
            xmlCheckDefaultedAttributes((xmlParserCtxtPtr)ret,prefix,att,(xmlChar **)ctxt);
          }
          if (ctxt != (xmlParserCtxtPtr)0x0) {
            local_64 = 2;
            _chk = (_xmlSAXHandler *)ctxt->userData;
            value = (xmlChar *)ctxt->sax;
            while (value != (xmlChar *)0x0 && _chk != (_xmlSAXHandler *)0x0) {
              if ((((*value == 'x') && (value[1] == 'm')) && (value[2] == 'l')) &&
                 ((value[3] == 'n' && (value[4] == 's')))) {
                xmlSAX2AttributeInternal(ret,value,(xmlChar *)_chk,att);
              }
              iVar1 = local_64 + 1;
              lVar3 = (long)local_64;
              local_64 = local_64 + 2;
              _chk = (&ctxt->sax)[iVar1];
              value = (xmlChar *)(&ctxt->sax)[lVar3];
            }
          }
          name = (xmlChar *)xmlSearchNs((xmlDocPtr)ret->name,parent,att);
          if (((xmlNsPtr)name == (xmlNsPtr)0x0) && (ns != (xmlNsPtr)0x0)) {
            name = (xmlChar *)xmlSearchNs((xmlDocPtr)ret->name,(xmlNodePtr)ns,att);
          }
          if ((att != (xmlChar *)0x0) && (name == (xmlChar *)0x0)) {
            name = (xmlChar *)xmlNewNs(parent,(xmlChar *)0x0,att);
            xmlNsWarnMsg((xmlParserCtxtPtr)ret,XML_NS_ERR_UNDEFINED_NAMESPACE,
                         "Namespace prefix %s is not defined\n",att,(xmlChar *)0x0);
          }
          if (((name != (xmlChar *)0x0) && (*(long *)(name + 0x10) != 0)) &&
             ((**(char **)(name + 0x10) != '\0' || (*(long *)(name + 0x18) != 0)))) {
            xmlSetNs(parent,(xmlNsPtr)name);
          }
        }
        if (ctxt != (xmlParserCtxtPtr)0x0) {
          value = (xmlChar *)ctxt->sax;
          local_64 = 2;
          _chk = (_xmlSAXHandler *)ctxt->userData;
          if (*(int *)((long)&ret->next + 4) == 0) {
            while (value != (xmlChar *)0x0 && _chk != (_xmlSAXHandler *)0x0) {
              if ((((*value != 'x') || (value[1] != 'm')) || (value[2] != 'l')) ||
                 ((value[3] != 'n' || (value[4] != 's')))) {
                xmlSAX2AttributeInternal(ret,value,(xmlChar *)_chk,(xmlChar *)0x0);
              }
              iVar1 = local_64 + 1;
              lVar3 = (long)local_64;
              local_64 = local_64 + 2;
              _chk = (&ctxt->sax)[iVar1];
              value = (xmlChar *)(&ctxt->sax)[lVar3];
            }
          }
          else {
            while (value != (xmlChar *)0x0) {
              xmlSAX2AttributeInternal(ret,value,(xmlChar *)_chk,(xmlChar *)0x0);
              iVar1 = local_64 + 1;
              lVar3 = (long)local_64;
              local_64 = local_64 + 2;
              _chk = (&ctxt->sax)[iVar1];
              value = (xmlChar *)(&ctxt->sax)[lVar3];
            }
          }
        }
        if ((*(int *)((long)&ret[1].last + 4) != 0) && (((ulong)ret[1].properties & 1) == 0)) {
          iVar1 = xmlValidateDtdFinal((xmlValidCtxtPtr)&ret[1].parent,(xmlDocPtr)ret->name);
          if (iVar1 < 1) {
            *(undefined4 *)&ret[1].last = 0;
          }
          if (iVar1 < 0) {
            *(undefined4 *)&ret->children = 0;
          }
          uVar2 = xmlValidateRoot((xmlValidCtxtPtr)&ret[1].parent,(xmlDocPtr)ret->name);
          *(uint *)&ret[1].last = uVar2 & *(uint *)&ret[1].last;
          *(uint *)&ret[1].properties = *(uint *)&ret[1].properties | 1;
        }
        if (att != (xmlChar *)0x0) {
          (*xmlFree)(att);
        }
      }
    }
  }
  return;
}

Assistant:

void
xmlSAX2StartElement(void *ctx, const xmlChar *fullname, const xmlChar **atts)
{
    xmlParserCtxtPtr ctxt = (xmlParserCtxtPtr) ctx;
    xmlNodePtr ret;
    xmlNodePtr parent;
    xmlNsPtr ns;
    xmlChar *name;
    xmlChar *prefix;
    const xmlChar *att;
    const xmlChar *value;
    int i;

    if ((ctx == NULL) || (fullname == NULL) || (ctxt->myDoc == NULL)) return;
    parent = ctxt->node;
#ifdef DEBUG_SAX
    xmlGenericError(xmlGenericErrorContext,
	    "SAX.xmlSAX2StartElement(%s)\n", fullname);
#endif

    /*
     * First check on validity:
     */
    if (ctxt->validate && (ctxt->myDoc->extSubset == NULL) &&
        ((ctxt->myDoc->intSubset == NULL) ||
	 ((ctxt->myDoc->intSubset->notations == NULL) &&
	  (ctxt->myDoc->intSubset->elements == NULL) &&
	  (ctxt->myDoc->intSubset->attributes == NULL) &&
	  (ctxt->myDoc->intSubset->entities == NULL)))) {
	xmlErrValid(ctxt, XML_ERR_NO_DTD,
	  "Validation failed: no DTD found !", NULL, NULL);
	ctxt->validate = 0;
    }


    /*
     * Split the full name into a namespace prefix and the tag name
     */
    name = xmlSplitQName(ctxt, fullname, &prefix);


    /*
     * Note : the namespace resolution is deferred until the end of the
     *        attributes parsing, since local namespace can be defined as
     *        an attribute at this level.
     */
    ret = xmlNewDocNodeEatName(ctxt->myDoc, NULL, name, NULL);
    if (ret == NULL) {
        if (prefix != NULL)
	    xmlFree(prefix);
	xmlSAX2ErrMemory(ctxt, "xmlSAX2StartElement");
        return;
    }
    if (ctxt->myDoc->children == NULL) {
#ifdef DEBUG_SAX_TREE
	xmlGenericError(xmlGenericErrorContext, "Setting %s as root\n", name);
#endif
        xmlAddChild((xmlNodePtr) ctxt->myDoc, (xmlNodePtr) ret);
    } else if (parent == NULL) {
        parent = ctxt->myDoc->children;
    }
    ctxt->nodemem = -1;
    if (ctxt->linenumbers) {
	if (ctxt->input != NULL) {
	    if ((unsigned) ctxt->input->line < (unsigned) USHRT_MAX)
		ret->line = ctxt->input->line;
	    else
	        ret->line = USHRT_MAX;
	}
    }

    /*
     * We are parsing a new node.
     */
#ifdef DEBUG_SAX_TREE
    xmlGenericError(xmlGenericErrorContext, "pushing(%s)\n", name);
#endif
    if (nodePush(ctxt, ret) < 0) {
        xmlUnlinkNode(ret);
        xmlFreeNode(ret);
        if (prefix != NULL)
            xmlFree(prefix);
        return;
    }

    /*
     * Link the child element
     */
    if (parent != NULL) {
        if (parent->type == XML_ELEMENT_NODE) {
#ifdef DEBUG_SAX_TREE
	    xmlGenericError(xmlGenericErrorContext,
		    "adding child %s to %s\n", name, parent->name);
#endif
	    xmlAddChild(parent, ret);
	} else {
#ifdef DEBUG_SAX_TREE
	    xmlGenericError(xmlGenericErrorContext,
		    "adding sibling %s to ", name);
	    xmlDebugDumpOneNode(stderr, parent, 0);
#endif
	    xmlAddSibling(parent, ret);
	}
    }

    if (!ctxt->html) {
        /*
         * Insert all the defaulted attributes from the DTD especially
         * namespaces
         */
        if ((ctxt->myDoc->intSubset != NULL) ||
            (ctxt->myDoc->extSubset != NULL)) {
            xmlCheckDefaultedAttributes(ctxt, name, prefix, atts);
        }

        /*
         * process all the attributes whose name start with "xmlns"
         */
        if (atts != NULL) {
            i = 0;
            att = atts[i++];
            value = atts[i++];
	    while ((att != NULL) && (value != NULL)) {
		if ((att[0] == 'x') && (att[1] == 'm') && (att[2] == 'l') &&
		    (att[3] == 'n') && (att[4] == 's'))
		    xmlSAX2AttributeInternal(ctxt, att, value, prefix);

		att = atts[i++];
		value = atts[i++];
	    }
        }

        /*
         * Search the namespace, note that since the attributes have been
         * processed, the local namespaces are available.
         */
        ns = xmlSearchNs(ctxt->myDoc, ret, prefix);
        if ((ns == NULL) && (parent != NULL))
            ns = xmlSearchNs(ctxt->myDoc, parent, prefix);
        if ((prefix != NULL) && (ns == NULL)) {
            ns = xmlNewNs(ret, NULL, prefix);
            xmlNsWarnMsg(ctxt, XML_NS_ERR_UNDEFINED_NAMESPACE,
                         "Namespace prefix %s is not defined\n",
                         prefix, NULL);
        }

        /*
         * set the namespace node, making sure that if the default namespace
         * is unbound on a parent we simply keep it NULL
         */
        if ((ns != NULL) && (ns->href != NULL) &&
            ((ns->href[0] != 0) || (ns->prefix != NULL)))
            xmlSetNs(ret, ns);
    }

    /*
     * process all the other attributes
     */
    if (atts != NULL) {
        i = 0;
	att = atts[i++];
	value = atts[i++];
	if (ctxt->html) {
	    while (att != NULL) {
		xmlSAX2AttributeInternal(ctxt, att, value, NULL);
		att = atts[i++];
		value = atts[i++];
	    }
	} else {
	    while ((att != NULL) && (value != NULL)) {
		if ((att[0] != 'x') || (att[1] != 'm') || (att[2] != 'l') ||
		    (att[3] != 'n') || (att[4] != 's'))
		    xmlSAX2AttributeInternal(ctxt, att, value, NULL);

		/*
		 * Next ones
		 */
		att = atts[i++];
		value = atts[i++];
	    }
	}
    }

#ifdef LIBXML_VALID_ENABLED
    /*
     * If it's the Document root, finish the DTD validation and
     * check the document root element for validity
     */
    if ((ctxt->validate) &&
        ((ctxt->vctxt.flags & XML_VCTXT_DTD_VALIDATED) == 0)) {
	int chk;

	chk = xmlValidateDtdFinal(&ctxt->vctxt, ctxt->myDoc);
	if (chk <= 0)
	    ctxt->valid = 0;
	if (chk < 0)
	    ctxt->wellFormed = 0;
	ctxt->valid &= xmlValidateRoot(&ctxt->vctxt, ctxt->myDoc);
	ctxt->vctxt.flags |= XML_VCTXT_DTD_VALIDATED;
    }
#endif /* LIBXML_VALID_ENABLED */

    if (prefix != NULL)
	xmlFree(prefix);

}